

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *other;
  ssize_t sVar4;
  int *piVar5;
  uint uVar6;
  void *__buf;
  LogMessage local_78;
  void *local_40;
  int local_38;
  LogFinisher local_31;
  
  local_40 = buffer;
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xdb);
    other = internal::LogMessage::operator<<(&local_78,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage(&local_78);
  }
  uVar6 = 0;
  local_38 = size;
  do {
    iVar2 = local_38 - uVar6;
    bVar1 = local_38 < (int)uVar6;
    if (iVar2 == 0 || local_38 < (int)uVar6) {
      return true;
    }
    __buf = (void *)((ulong)uVar6 + (long)local_40);
    while( true ) {
      sVar4 = write(this->file_,__buf,(long)iVar2);
      iVar3 = (int)sVar4;
      if (-1 < iVar3) break;
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        this->errno_ = *piVar5;
        return false;
      }
    }
    uVar6 = uVar6 + iVar3;
    if (iVar3 == 0) {
      return iVar2 == 0 || bVar1;
    }
  } while( true );
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8* buffer_base = reinterpret_cast<const uint8*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}